

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O0

void dict2pid_dump(FILE *fp,dict2pid_t *d2p,mdef_t *mdef,dict_t *dict)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int local_48;
  int local_44;
  int32 r;
  int32 l;
  int32 b;
  int32 j;
  int32 i;
  int32 pronlen;
  int32 p;
  int32 w;
  dict_t *dict_local;
  mdef_t *mdef_local;
  dict2pid_t *d2p_local;
  FILE *fp_local;
  
  fprintf((FILE *)fp,"# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
  for (pronlen = 0; pronlen < dict->n_word; pronlen = pronlen + 1) {
    fprintf((FILE *)fp,"%30s ",dict->word[pronlen].word);
    iVar1 = dict->word[pronlen].pronlen;
    for (i = 0; i < iVar1; i = i + 1) {
      fprintf((FILE *)fp," %5d",(ulong)(uint)d2p->internal[pronlen][i]);
    }
    fprintf((FILE *)fp,"\n");
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# LDIPH_LC (b r l ssid)\n");
  for (r = 0; r < mdef->n_ciphone; r = r + 1) {
    for (local_48 = 0; local_48 < mdef->n_ciphone; local_48 = local_48 + 1) {
      for (local_44 = 0; local_44 < mdef->n_ciphone; local_44 = local_44 + 1) {
        if (-1 < d2p->ldiph_lc[r][local_48][local_44]) {
          pcVar2 = mdef_ciphone_str(mdef,(s3cipid_t)r);
          pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)local_48);
          pcVar4 = mdef_ciphone_str(mdef,(s3cipid_t)local_44);
          fprintf((FILE *)fp,"%6s %6s %6s %5d\n",pcVar2,pcVar3,pcVar4,
                  (ulong)(uint)d2p->ldiph_lc[r][local_48][local_44]);
        }
      }
    }
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# SINGLE_LC (b l comssid)\n");
  for (r = 0; r < mdef->n_ciphone; r = r + 1) {
    for (local_44 = 0; local_44 < mdef->n_ciphone; local_44 = local_44 + 1) {
      if (-1 < d2p->single_lc[r][local_44]) {
        pcVar2 = mdef_ciphone_str(mdef,(s3cipid_t)r);
        pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)local_44);
        fprintf((FILE *)fp,"%6s %6s %5d\n",pcVar2,pcVar3,(ulong)(uint)d2p->single_lc[r][local_44]);
      }
    }
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# SSEQ %d (senid senid ...)\n",(ulong)(uint)mdef->n_sseq);
  for (b = 0; b < mdef->n_sseq; b = b + 1) {
    fprintf((FILE *)fp,"%5d ",(ulong)(uint)b);
    for (l = 0; l < mdef->n_emit_state; l = l + 1) {
      fprintf((FILE *)fp," %5d",(ulong)(uint)(int)mdef->sseq[b][l]);
    }
    fprintf((FILE *)fp,"\n");
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# COMSSEQ %d (comstate comstate ...)\n",(ulong)(uint)d2p->n_comsseq);
  for (b = 0; b < d2p->n_comsseq; b = b + 1) {
    fprintf((FILE *)fp,"%5d ",(ulong)(uint)b);
    for (l = 0; l < mdef->n_emit_state; l = l + 1) {
      fprintf((FILE *)fp," %5d",(ulong)(uint)(int)d2p->comsseq[b][l]);
    }
    fprintf((FILE *)fp,"\n");
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# COMSTATE %d (senid senid ...)\n",(ulong)(uint)d2p->n_comstate);
  for (b = 0; b < d2p->n_comstate; b = b + 1) {
    fprintf((FILE *)fp,"%5d ",(ulong)(uint)b);
    for (l = 0; -1 < d2p->comstate[b][l]; l = l + 1) {
      fprintf((FILE *)fp," %5d",(ulong)(uint)(int)d2p->comstate[b][l]);
    }
    fprintf((FILE *)fp,"\n");
  }
  fprintf((FILE *)fp,"#\n");
  fprintf((FILE *)fp,"# END\n");
  fflush((FILE *)fp);
  return;
}

Assistant:

void
dict2pid_dump(FILE * fp, dict2pid_t * d2p, mdef_t * mdef, dict_t * dict)
{
    int32 w, p, pronlen;
    int32 i, j, b, l, r;

    fprintf(fp, "# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
    for (w = 0; w < dict_size(dict); w++) {
        fprintf(fp, "%30s ", dict_wordstr(dict, w));

        pronlen = dict_pronlen(dict, w);
        for (p = 0; p < pronlen; p++)
            fprintf(fp, " %5d", d2p->internal[w][p]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# LDIPH_LC (b r l ssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (r = 0; r < mdef_n_ciphone(mdef); r++) {
            for (l = 0; l < mdef_n_ciphone(mdef); l++) {
                if (IS_S3SSID(d2p->ldiph_lc[b][r][l]))
                    fprintf(fp, "%6s %6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) r), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->ldiph_lc[b][r][l]);      /* RAH, ldiph_lc is returning an int32, %d expects an int16 */
            }
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SINGLE_LC (b l comssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (l = 0; l < mdef_n_ciphone(mdef); l++) {
            if (IS_S3SSID(d2p->single_lc[b][l]))
                fprintf(fp, "%6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->single_lc[b][l]);       /* RAH, single_lc is returning an int32, %d expects an int16 */
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SSEQ %d (senid senid ...)\n", mdef->n_sseq);
    for (i = 0; i < mdef->n_sseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", mdef->sseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSSEQ %d (comstate comstate ...)\n", d2p->n_comsseq);
    for (i = 0; i < d2p->n_comsseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", d2p->comsseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSTATE %d (senid senid ...)\n", d2p->n_comstate);
    for (i = 0; i < d2p->n_comstate; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; IS_S3SENID(d2p->comstate[i][j]); j++)
            fprintf(fp, " %5d", d2p->comstate[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");
    fprintf(fp, "# END\n");

    fflush(fp);
}